

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)6>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  cells *__x;
  environment *this;
  SchemeFrame *this_00;
  runtime_error *this_01;
  bool bVar1;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  __first;
  string *var;
  allocator_type local_131;
  env_p new_env;
  cells args;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_e8;
  cell body;
  cell proc;
  
  cell::cell(&proc,it._M_current);
  __first._M_current = it._M_current + 1;
  args.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (proc.type == Lambda) {
    if (proc.list.
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_start[1].type == List) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      operator=(&args,&proc.list.
                       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].list);
    }
    else if (proc.list.
             super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[1].type == Symbol) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&args,proc.list.
                      super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
      __x = &frame->resolved_arguments;
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              *)&new_env,__x);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      clear(__x);
      cell::cell(&body,(vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                        *)&new_env);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      emplace_back<implementations::scheme::cell>(__x,&body);
      cell::~cell(&body);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               *)&new_env);
    }
    cell::cell(&body,proc.list.
                     super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
    this = (environment *)operator_new(0x98);
    std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_e8,
                 &proc.env.
                  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                );
    environment::environment(this,(env_p *)&local_e8);
    std::__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<implementations::scheme::environment,void>
              ((__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2> *)
               &new_env,this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
    var = &(args.
            super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
            ._M_impl.super__Vector_impl_data._M_start)->val;
    for (; __first._M_current !=
           (frame->resolved_arguments).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_finish; __first._M_current = __first._M_current + 1)
    {
      environment::define(new_env.
                          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,var,__first._M_current);
      var = (string *)((long)&var[2].field_2 + 8);
    }
    frame->subframe_mode = Procedure;
    this_00 = (SchemeFrame *)operator_new(0x138);
    std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_f8,
                 &new_env.
                  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                );
    SchemeFrame::SchemeFrame(this_00,&body,(env_p *)&local_f8);
    frame->subframe = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_env.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cell::~cell(&body);
    bVar1 = false;
  }
  else {
    if (proc.type != Proc) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Dont know how to run this proc");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
    vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
              ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                *)&new_env,__first,
               (frame->resolved_arguments).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_131);
    (*proc.proc)(&body,(vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                        *)&new_env);
    cell::operator=(&(frame->
                     super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                     ).result,&body);
    cell::~cell(&body);
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *
            )&new_env);
    bVar1 = true;
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&args);
  cell::~cell(&proc);
  return bVar1;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		cell proc(*it); ++it;

		cells args;
		switch (proc.type) {
		// Proc: a builtin procedure in C++
		// We call this immediately. If it blocks, that is up
		// to the caller.
		case Proc:
			// Copy the rest of the resolved arguments to a new list,
			// that list is passed as the arguments.
			frame.result = proc.proc(cells(it, frame.resolved_arguments.cend()));
			return true;
		// Lambda: a Scheme procedure
		// We create a subframe to run the procedure, along with
		// an environment with arguments set to correct values.
		case Lambda:
		{
			// Arguments
			const cell &arglist = proc.list[1];
			switch (arglist.type) {
			case Symbol:
				// Single argument, assign all args as list
				args.push_back(arglist);
				// Convert resolved arguments to single list
				{
					cells tmp(frame.resolved_arguments);
					frame.resolved_arguments.clear();
					frame.resolved_arguments.push_back(tmp);
				}
				break;
			case List:
				// List of arguments
				args = arglist.list;
				break;
			}
			// Body
			const cell body = proc.list[2];
			// Create environment parented to lambda env
			env_p new_env(new environment(proc.env));
			auto env_arg_it = args.cbegin();
			// assign remaining arguments to our list of argument
			// names in new environment.
			for (; it != frame.resolved_arguments.cend(); ++env_arg_it, ++it) {
				DEBUG(std::string("    set lambda.") + env_arg_it->val + std::string(" = ") + to_string(*it));
				new_env->define(env_arg_it->val, *it);
			}
			// Create subframe
			frame.subframe_mode = SchemeFrame::Procedure;
			frame.subframe = new SchemeFrame(body, new_env);
			// Don't move exp_it
			return false;
		}
		default:
			throw std::runtime_error("Dont know how to run this proc");
		}
	}